

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O2

void __thiscall
Camera::update_angle
          (Camera *this,float delta_time,double mouse_x,double mouse_y,int display_w,int display_h)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  float fVar8;
  
  dVar3 = (double)(delta_time * this->mouse_speed);
  uVar1 = this->horizontal_angle;
  uVar2 = this->vertical_angle;
  fVar8 = (float)(dVar3 * ((double)display_h * 0.5 - mouse_y) + (double)(float)uVar2);
  this->horizontal_angle =
       (float)(dVar3 * ((double)display_w * 0.5 - mouse_x) + (double)(float)uVar1);
  this->vertical_angle = fVar8;
  dVar3 = cos((double)fVar8);
  dVar4 = sin((double)this->horizontal_angle);
  dVar5 = sin((double)this->vertical_angle);
  dVar6 = cos((double)this->vertical_angle);
  dVar7 = cos((double)this->horizontal_angle);
  (this->direction).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(float)(dVar4 * dVar3);
  (this->direction).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(float)dVar5;
  (this->direction).field_2.z = (float)(dVar7 * dVar6);
  dVar3 = sin((double)(this->horizontal_angle + -1.575795));
  dVar4 = cos((double)(this->horizontal_angle + -1.570795));
  (this->right).field_0.x = (float)dVar3;
  (this->right).field_1.y = 0.0;
  (this->right).field_2.z = (float)dVar4;
  return;
}

Assistant:

void Camera::update_angle(float delta_time, double mouse_x, double mouse_y, int display_w, int display_h) {
    horizontal_angle += mouse_speed * delta_time * (display_w/2.0 - mouse_x);
    vertical_angle   += mouse_speed * delta_time * (display_h/2.0 - mouse_y);
    
    direction = glm::vec3(
        cos(vertical_angle) * sin(horizontal_angle),
        sin(vertical_angle),
        cos(vertical_angle) * cos(horizontal_angle)
    );

    right = glm::vec3(
        sin(horizontal_angle - 3.15159f/2.0f),
        0,
        cos(horizontal_angle - 3.14159f/2.0f)
    );
}